

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.cpp
# Opt level: O3

void __thiscall
GmmLib::GmmPageTableMgr::__ReleaseUnusedPool(GmmPageTableMgr *this,GMM_UMD_SYNCCONTEXT *UmdContext)

{
  GmmPageTablePool **ppGVar1;
  GMM_DEVICE_CALLBACKS_INT *pDeviceCb;
  GMM_GFX_SIZE_T GVar2;
  GMM_CLIENT ClientType;
  bool bVar3;
  uint uVar4;
  int iVar5;
  GmmClientContext *pClientContext;
  uint64_t uVar6;
  HANDLE pvVar7;
  GmmPageTablePool **ppGVar8;
  GmmClientContext *pGVar9;
  GmmPageTablePool *pGVar10;
  GmmPageTablePool *this_00;
  uint uVar11;
  undefined1 local_98 [8];
  GMM_DEVICE_DEALLOC Dealloc;
  GmmClientContext *local_48;
  GMM_GFX_SIZE_T PoolSizeToFree;
  GMM_CLIENT local_34;
  
  local_48 = (GmmClientContext *)0x0;
  if (this->pClientContext == (GmmClientContext *)0x0) {
    local_34 = GMM_UNDEFINED_CLIENT;
  }
  else {
    local_34 = (*this->pClientContext->_vptr_GmmClientContext[2])();
  }
  if (this->AuxTTObj != (AuxTable *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&this->PoolLock);
  }
  PoolSizeToFree = (GMM_GFX_SIZE_T)this;
  bVar3 = GmmPageTablePool::__IsUnusedTRTTPoolOverLimit(this->pPool,(GMM_GFX_SIZE_T *)&local_48);
  if ((bVar3) &&
     (uVar4 = *(uint *)(PoolSizeToFree + 0x20), local_48 != (GmmClientContext *)0x0 && uVar4 != 0))
  {
    ppGVar1 = (GmmPageTablePool **)(PoolSizeToFree + 0x18);
    pDeviceCb = (GMM_DEVICE_CALLBACKS_INT *)(PoolSizeToFree + 0x80);
    uVar11 = 1;
    pGVar9 = (GmmClientContext *)0x0;
    pClientContext = local_48;
    pGVar10 = (GmmPageTablePool *)0x0;
    do {
      ClientType = local_34;
      ppGVar8 = &pGVar10->NextPool;
      if (pGVar10 == (GmmPageTablePool *)0x0) {
        ppGVar8 = ppGVar1;
      }
      if (UmdContext == (GMM_UMD_SYNCCONTEXT *)0x0) {
        uVar6 = 1;
        pvVar7 = (HANDLE)0x0;
      }
      else {
        pvVar7 = UmdContext->BBFenceObj;
        uVar6 = UmdContext->BBLastFence + 1;
      }
      this_00 = *ppGVar8;
      if ((0x1ff < this_00->NumFreeNodes) &&
         (((this_00->PoolBBInfo).BBQueueHandle != pvVar7 || ((this_00->PoolBBInfo).BBFence != uVar6)
          ))) {
        iVar5 = GmmCheckForNullDevCbPfn(local_34,pDeviceCb,GMM_DEV_CB_WAIT_FROM_CPU);
        if (iVar5 != 0) {
          Dealloc.hCsr = this_00->PoolHandle;
          GmmDeviceCallback(ClientType,pDeviceCb,
                            (GMM_DDI_WAITFORSYNCHRONIZATIONOBJECTFROMCPU *)&Dealloc.hCsr);
        }
        GVar2 = PoolSizeToFree;
        local_98 = (undefined1  [8])this_00->PoolHandle;
        Dealloc.Handle = (HANDLE)this_00->PoolGfxAddress;
        Dealloc.GfxVA = (GMM_GFX_ADDRESS)this_00->pGmmResInfo;
        Dealloc.Priv = *(void **)(PoolSizeToFree + 0xd8);
        __GmmDeviceDealloc(ClientType,pDeviceCb,(GMM_DEVICE_DEALLOC *)local_98,pClientContext);
        ppGVar8 = &pGVar10->NextPool;
        if (pGVar10 == (GmmPageTablePool *)0x0) {
          ppGVar8 = ppGVar1;
        }
        *ppGVar8 = this_00->NextPool;
        GmmPageTablePool::~GmmPageTablePool(this_00);
        operator_delete(this_00);
        pGVar9 = (GmmClientContext *)&pGVar9[0x6666].DeviceCB;
        uVar4 = *(uint *)(GVar2 + 0x20);
        pClientContext = local_48;
        this_00 = pGVar10;
      }
    } while ((uVar11 < uVar4) && (uVar11 = uVar11 + 1, pGVar10 = this_00, pGVar9 < pClientContext));
  }
  if (*(long *)(PoolSizeToFree + 0x10) != 0) {
    pthread_mutex_unlock((pthread_mutex_t *)(PoolSizeToFree + 0x30));
  }
  return;
}

Assistant:

void GmmLib::GmmPageTableMgr::__ReleaseUnusedPool(GMM_UMD_SYNCCONTEXT *UmdContext)
{
    GMM_STATUS                 Status         = GMM_SUCCESS;
    GMM_GFX_SIZE_T             PoolSizeToFree = {0};
    GMM_GFX_SIZE_T             FreedSize      = {0};
    GmmLib::GMM_PAGETABLEPool *Pool = NULL, *PrevPool = NULL;
    uint32_t                   i = 0;
    GMM_CLIENT                 ClientType;
    GMM_DEVICE_DEALLOC         Dealloc;

    GET_GMM_CLIENT_TYPE(pClientContext, ClientType);

    ENTER_CRITICAL_SECTION
    if(pPool->__IsUnusedTRTTPoolOverLimit(&PoolSizeToFree))
    {
        for(i = 0; i < NumNodePoolElements && FreedSize < PoolSizeToFree; i++)
        {
            Pool = (PrevPool) ? PrevPool->GetNextPool() : pPool;

            if(Pool->IsPoolInUse(UmdContext ? SyncInfo(UmdContext->BBFenceObj, UmdContext->BBLastFence) : SyncInfo()))
            {
                PrevPool = Pool;
                continue;
            }

            if(GmmCheckForNullDevCbPfn(ClientType, &DeviceCbInt, GMM_DEV_CB_WAIT_FROM_CPU))
            {
                GMM_DDI_WAITFORSYNCHRONIZATIONOBJECTFROMCPU Wait = {0};
                Wait.bo                                          = Pool->GetPoolHandle();
                GmmDeviceCallback(ClientType, &DeviceCbInt, &Wait);
            }

            Dealloc.Handle = Pool->GetPoolHandle();
            Dealloc.GfxVA  = Pool->GetGfxAddress();
            Dealloc.Priv   = Pool->GetGmmResInfo();
            Dealloc.hCsr   = hCsr;

            Status = __GmmDeviceDealloc(ClientType, &DeviceCbInt, &Dealloc, pClientContext);

            __GMM_ASSERT(GMM_SUCCESS == Status);

            if(PrevPool)
            {
                PrevPool->GetNextPool() = Pool->GetNextPool();
            }
            else
            {
                pPool = Pool->GetNextPool();
            }
            delete Pool;
            FreedSize += PAGETABLE_POOL_SIZE;
        }
    }
    EXIT_CRITICAL_SECTION
}